

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  uv_handle_t *h;
  uv__queue *q;
  char *type;
  FILE *stream_local;
  uv_loop_t *puStack_10;
  int only_active_local;
  uv_loop_t *loop_local;
  
  puStack_10 = loop;
  if (loop == (uv_loop_t *)0x0) {
    puStack_10 = uv_default_loop();
  }
  for (h = (uv_handle_t *)(puStack_10->handle_queue).next;
      h != (uv_handle_t *)&puStack_10->handle_queue; h = (uv_handle_t *)h->data) {
    if ((only_active == 0) ||
       (((undefined1  [32])h->u & (undefined1  [32])0x4) != (undefined1  [32])0x0)) {
      switch(*(undefined4 *)&h[-1].next_closing) {
      case 1:
        q = (uv__queue *)anon_var_dwarf_eb12e;
        break;
      case 2:
        q = (uv__queue *)anon_var_dwarf_eb13a;
        break;
      case 3:
        q = (uv__queue *)anon_var_dwarf_eb146;
        break;
      case 4:
        q = (uv__queue *)anon_var_dwarf_eb152;
        break;
      case 5:
        q = (uv__queue *)0x236174;
        break;
      case 6:
        q = (uv__queue *)anon_var_dwarf_eb16a;
        break;
      case 7:
        q = (uv__queue *)0x2348a3;
        break;
      case 8:
        q = (uv__queue *)0x234b90;
        break;
      case 9:
        q = (uv__queue *)anon_var_dwarf_eb19a;
        break;
      case 10:
        q = (uv__queue *)0x234957;
        break;
      case 0xb:
        q = (uv__queue *)0x2369b1;
        break;
      case 0xc:
        q = (uv__queue *)anon_var_dwarf_eb1be;
        break;
      case 0xd:
        q = (uv__queue *)anon_var_dwarf_eb1ca;
        break;
      case 0xe:
        q = (uv__queue *)anon_var_dwarf_eb1d6;
        break;
      case 0xf:
        q = (uv__queue *)anon_var_dwarf_eb1e2;
        break;
      case 0x10:
        q = (uv__queue *)anon_var_dwarf_eb1ee;
        break;
      default:
        q = (uv__queue *)anon_var_dwarf_eb1fa;
      }
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x8)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"A-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x4)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"I-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x10)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],q,
              (undefined1 *)((long)&h[-1].u + 0x10));
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  struct uv__queue* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  uv__queue_foreach(q, &loop->handle_queue) {
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}